

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O2

int namingConventions::namingConventionsClasses
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *inputFiles)

{
  pointer pbVar1;
  bool bVar2;
  Pda *this;
  Pda *this_00;
  pointer pbVar3;
  istream *piVar4;
  string *this_01;
  string line;
  vector<Pda_*,_std::allocator<Pda_*>_> classPdas;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oldclassNames;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newclassNames;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string cl;
  string local_408;
  string name;
  fstream buffer;
  stringstream stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cl,"class",(allocator<char> *)&buffer);
  this = makeNamePda(&cl);
  this_00 = (Pda *)operator_new(0x90);
  Pda::Pda(this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"vbn/NamingConvTests/classChecker.json",(allocator<char> *)&buffer
            );
  Pda::readJson(this_00,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::fstream::fstream(&buffer);
  oldclassNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  oldclassNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  oldclassNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  newclassNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newclassNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  newclassNames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  classPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  classPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  classPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  pbVar3 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (inputFiles->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar3 == pbVar1) {
      adjustForAllFiles(inputFiles,&oldclassNames,&classPdas,true);
      std::_Vector_base<Pda_*,_std::allocator<Pda_*>_>::~_Vector_base
                (&classPdas.super__Vector_base<Pda_*,_std::allocator<Pda_*>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&newclassNames);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&oldclassNames);
      std::fstream::~fstream(&buffer);
      std::__cxx11::string::~string((string *)&cl);
      return 0;
    }
    std::fstream::open((char *)&buffer,(_Ios_Openmode)(pbVar3->_M_dataplus)._M_p);
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&buffer,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&line,_S_out|_S_in)
      ;
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      bVar2 = false;
      while( true ) {
        piVar4 = std::operator>>((istream *)&stream,(string *)&word);
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        if (bVar2 != false) {
          findClassName(&name,&word);
          std::__cxx11::string::string((string *)&local_488,(string *)&name);
          bVar2 = Pda::traverse(this_00,&local_488);
          if (bVar2) {
            this_01 = &local_488;
LAB_00127933:
            std::__cxx11::string::~string((string *)this_01);
          }
          else {
            bVar2 = std::operator!=(&name,"");
            std::__cxx11::string::~string((string *)&local_488);
            if (bVar2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&oldclassNames,&name);
              local_4a8._M_dataplus._M_p = (pointer)makeNamePda(&name);
              std::vector<Pda*,std::allocator<Pda*>>::emplace_back<Pda*>
                        ((vector<Pda*,std::allocator<Pda*>> *)&classPdas,(Pda **)&local_4a8);
              std::__cxx11::string::string((string *)&local_448,(string *)&name);
              correctClassName(&local_4a8,&local_448);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &newclassNames,&local_4a8);
              std::__cxx11::string::~string((string *)&local_4a8);
              this_01 = &local_448;
              goto LAB_00127933;
            }
          }
          std::__cxx11::string::~string((string *)&name);
        }
        std::__cxx11::string::string((string *)&local_408,(string *)&word);
        bVar2 = Pda::traverse(this,&local_408);
        std::__cxx11::string::~string((string *)&local_408);
      }
      std::__cxx11::string::~string((string *)&word);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    }
    std::fstream::close();
    std::__cxx11::string::~string((string *)&line);
    pbVar3 = pbVar3 + 1;
  } while( true );
}

Assistant:

int namingConventions::namingConventionsClasses(const std::vector<std::string> &inputFiles) {
    std::string cl = "class";
    Pda *classRecognizer = makeNamePda(cl);
    Pda *classChecker = new Pda();
    classChecker->readJson("vbn/NamingConvTests/classChecker.json");
    std::fstream buffer;
    std::vector<std::string> oldclassNames;
    std::vector<std::string> newclassNames;
    std::vector<Pda *> classPdas;


// loop over files om alle classes te bepalen en een verbeterde versie hiervan op te slaan
    for (auto &file: inputFiles) {
        buffer.open(file.c_str());
        std::string line;
        while (std::getline(buffer, line)) {
            bool found = false;
            std::stringstream stream(line);
            std::string word;
            while (stream >> word) {
                if (found) {
                    std::string name = findClassName(word);
                    if (!classChecker->traverse(name) && name != "") {
                        oldclassNames.push_back(name);
                        classPdas.push_back(makeNamePda(name));
                        newclassNames.push_back(correctClassName(name));
                        found = false;

                    } else {
                        found = false;
                    }
                }
                if (classRecognizer->traverse(word)) {
                    found = true;
                }

            }

        }
        buffer.close();
    }
    adjustForAllFiles(inputFiles, oldclassNames, classPdas, true);
    return 0;

}